

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

char * load_ref_portion(BGZF *fp,ref_entry *e,int start,int end)

{
  int iVar1;
  size_t __size;
  size_t sVar2;
  long local_80;
  long local_68;
  int local_5c;
  int i_1;
  char *cp_to;
  char *cp;
  int j;
  int i;
  char *seq;
  off_t len;
  off_t offset;
  int end_local;
  int start_local;
  ref_entry *e_local;
  BGZF *fp_local;
  
  offset._0_4_ = end;
  if (end < start) {
    offset._0_4_ = start;
  }
  if (e->line_length == 0) {
    local_68 = (long)(start + -1);
  }
  else {
    local_68 = e->offset + (long)(((start + -1) / e->bases_per_line) * e->line_length) +
               (long)((start + -1) % e->bases_per_line);
  }
  if (e->line_length == 0) {
    local_80 = (long)((int)offset + -1);
  }
  else {
    local_80 = e->offset + (long)((((int)offset + -1) / e->bases_per_line) * e->line_length) +
               (long)(((int)offset + -1) % e->bases_per_line);
  }
  __size = (local_80 - local_68) + 1;
  iVar1 = bgzf_useek(fp,local_68,0);
  if (iVar1 < 0) {
    perror("bgzf_useek() on reference file");
    fp_local = (BGZF *)0x0;
  }
  else if ((__size == 0) || (fp_local = (BGZF *)malloc(__size), fp_local == (BGZF *)0x0)) {
    fp_local = (BGZF *)0x0;
  }
  else {
    sVar2 = bgzf_read(fp,fp_local,__size);
    if (__size == sVar2) {
      if (__size == (long)(((int)offset - start) + 1)) {
        for (local_5c = 0; (long)local_5c < (long)__size; local_5c = local_5c + 1) {
          *(byte *)((long)&fp_local->field_0x0 + (long)local_5c) =
               *(byte *)((long)&fp_local->field_0x0 + (long)local_5c) & 0xdf;
        }
      }
      else {
        cp._0_4_ = 0;
        for (cp._4_4_ = 0; (long)cp._4_4_ < (long)__size; cp._4_4_ = cp._4_4_ + 1) {
          if ((' ' < *(char *)((long)&fp_local->field_0x0 + (long)cp._4_4_)) &&
             (*(char *)((long)&fp_local->field_0x0 + (long)cp._4_4_) < '\x7f')) {
            *(byte *)((long)&fp_local->field_0x0 + (long)(int)cp) =
                 *(byte *)((long)&fp_local->field_0x0 + (long)cp._4_4_) & 0xdf;
            cp._0_4_ = (int)cp + 1;
          }
        }
        if ((int)cp != ((int)offset - start) + 1) {
          fprintf(_stderr,"Malformed reference file?\n");
          free(fp_local);
          fp_local = (BGZF *)0x0;
        }
      }
    }
    else {
      perror("bgzf_read() on reference file");
      free(fp_local);
      fp_local = (BGZF *)0x0;
    }
  }
  return (char *)fp_local;
}

Assistant:

static char *load_ref_portion(BGZF *fp, ref_entry *e, int start, int end) {
    off_t offset, len;
    char *seq;

    if (end < start)
	end = start;

    /*
     * Compute locations in file. This is trivial for the MD5 files, but
     * is still necessary for the fasta variants.
     */
    offset = e->line_length
	? e->offset + (start-1)/e->bases_per_line * e->line_length +
	  (start-1) % e->bases_per_line
	: start-1;

    len = (e->line_length
	   ? e->offset + (end-1)/e->bases_per_line * e->line_length + 
	     (end-1) % e->bases_per_line
	   : end-1) - offset + 1;

    if (bgzf_useek(fp, offset, SEEK_SET) < 0) {
	perror("bgzf_useek() on reference file");
	return NULL;
    }

    if (len == 0 || !(seq = malloc(len))) {
	return NULL;
    }

    if (len != bgzf_read(fp, seq, len)) {
	perror("bgzf_read() on reference file");
	free(seq);
	return NULL;
    }

    /* Strip white-space if required. */
    if (len != end-start+1) {
	int i, j;
	char *cp = seq;
	char *cp_to;

	for (i = j = 0; i < len; i++) {
	    if (cp[i] >= '!' && cp[i] <= '~')
		cp[j++] = cp[i] & ~0x20;
	}
	cp_to = cp+j;

	if (cp_to - seq != end-start+1) {
	    fprintf(stderr, "Malformed reference file?\n");
	    free(seq);
	    return NULL;
	}
    } else {
	int i;
	for (i = 0; i < len; i++) {
	    seq[i] = seq[i] & ~0x20; // uppercase in ASCII
	}
    }

    return seq;
}